

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::FetchUpdates
          (ColumnData *this,TransactionData transaction,idx_t vector_index,Vector *result,
          idx_t scan_count,bool allow_updates,bool scan_committed)

{
  bool bVar1;
  int iVar2;
  pointer pUVar3;
  TransactionException *this_00;
  unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true> *this_01;
  string local_50;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->update_lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  if ((this->updates).
      super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
      super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl != (UpdateSegment *)0x0) {
    this_01 = &this->updates;
    if (!allow_updates) {
      pUVar3 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
               operator->(this_01);
      bVar1 = UpdateSegment::HasUncommittedUpdates(pUVar3,vector_index);
      if (bVar1) {
        this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Cannot create index with outstanding updates","");
        TransactionException::TransactionException(this_00,&local_50);
        __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    Vector::Flatten(result,scan_count);
    if (scan_committed) {
      pUVar3 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
               operator->(this_01);
      UpdateSegment::FetchCommitted(pUVar3,vector_index,result);
    }
    else {
      pUVar3 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
               operator->(this_01);
      UpdateSegment::FetchUpdates(pUVar3,transaction,vector_index,result);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
  return;
}

Assistant:

void ColumnData::FetchUpdates(TransactionData transaction, idx_t vector_index, Vector &result, idx_t scan_count,
                              bool allow_updates, bool scan_committed) {
	lock_guard<mutex> update_guard(update_lock);
	if (!updates) {
		return;
	}
	if (!allow_updates && updates->HasUncommittedUpdates(vector_index)) {
		throw TransactionException("Cannot create index with outstanding updates");
	}
	result.Flatten(scan_count);
	if (scan_committed) {
		updates->FetchCommitted(vector_index, result);
	} else {
		updates->FetchUpdates(transaction, vector_index, result);
	}
}